

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.cpp
# Opt level: O3

void luaX_lexerror(LexState *ls,char *msg,int token)

{
  lua_State *L;
  char *pcVar1;
  char *pcVar2;
  char buff [80];
  char acStack_78 [88];
  
  luaO_chunkid(acStack_78,(char *)(ls->source + 1),0x50);
  pcVar1 = luaO_pushfstring(ls->L,"%s:%d: %s",acStack_78,(ulong)(uint)ls->linenumber,msg);
  if (token != 0) {
    L = ls->L;
    if (token - 0x11cU < 3) {
      save(ls,0);
      pcVar2 = ls->buff->buffer;
    }
    else {
      pcVar2 = luaX_token2str(ls,token);
    }
    luaO_pushfstring(L,"%s near \'%s\'",pcVar1,pcVar2);
  }
  luaD_throw(ls->L,3);
  return;
}

Assistant:

void luaX_lexerror (LexState *ls, const char *msg, int token) {
  char buff[MAXSRC];
  luaO_chunkid(buff, getstr(ls->source), MAXSRC);
  msg = luaO_pushfstring(ls->L, "%s:%d: %s", buff, ls->linenumber, msg);
  if (token)
    luaO_pushfstring(ls->L, "%s near " LUA_QS, msg, txtToken(ls, token));
  luaD_throw(ls->L, LUA_ERRSYNTAX);
}